

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O3

int __thiscall
CVmObjDict::getp_correct(CVmObjDict *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  CVmObjPageEntry *this_00;
  ushort uVar1;
  undefined4 uVar2;
  wchar_t wVar3;
  int iVar4;
  undefined8 *puVar5;
  undefined8 uVar6;
  bool bVar7;
  vm_datatype_t *pvVar8;
  vm_val_t *pvVar9;
  int iVar10;
  int iVar11;
  vm_obj_id_t vVar12;
  vm_obj_id_t vVar13;
  ushort *puVar14;
  size_t sVar15;
  wchar_t *buf;
  char *pcVar16;
  undefined8 *__ptr;
  long *plVar17;
  long lVar18;
  ulong uVar19;
  undefined8 *puVar20;
  ulong uVar21;
  corr_state *ret;
  CVmObjList *this_01;
  uint uVar22;
  corr_word *w;
  wchar_t *pwVar23;
  long *plVar24;
  vm_val_t val;
  utf8_ptr rp;
  undefined8 *local_a8;
  vm_val_t local_70;
  utf8_ptr local_60;
  long *local_58;
  ulong local_50;
  vm_val_t *local_48;
  undefined8 *local_40;
  long *local_38;
  
  if (getp_correct(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_correct();
  }
  iVar10 = CVmObject::get_prop_check_argc(retval,argc,&getp_correct::desc);
  if (iVar10 == 0) {
    local_48 = retval;
    puVar14 = (ushort *)CVmBif::pop_str_val();
    iVar10 = CVmBif::pop_int_val();
    uVar1 = *puVar14;
    local_50 = 0;
    sVar15 = utf8_ptr::to_wchar((wchar_t *)0x0,0,(char *)(puVar14 + 1),(ulong)uVar1);
    buf = (wchar_t *)operator_new__(-(ulong)(sVar15 + 1 >> 0x3e != 0) | sVar15 * 4 + 4);
    utf8_ptr::to_wcharz(buf,sVar15 + 1,(char *)(puVar14 + 1),(ulong)uVar1);
    pcVar16 = (this->super_CVmObject).ext_;
    if (*(int *)(pcVar16 + 0x30) == 1) {
      local_58 = *(long **)(pcVar16 + 0x28);
      local_50 = (**(code **)(*local_58 + 0x1f0))();
      pcVar16 = (this->super_CVmObject).ext_;
    }
    else {
      local_58 = (long *)0x0;
    }
    lVar18 = *(long *)(pcVar16 + 0x38);
    if (lVar18 == 0) {
      build_trie(this);
      lVar18 = *(long *)((this->super_CVmObject).ext_ + 0x38);
    }
    __ptr = (undefined8 *)malloc(0x38);
    __ptr[5] = 0;
    __ptr[1] = 0;
    __ptr[2] = 0;
    __ptr[3] = lVar18;
    *(undefined4 *)(__ptr + 4) = 0;
    *__ptr = 0;
    plVar24 = (long *)0x0;
    do {
      puVar5 = (undefined8 *)*__ptr;
      if ((*(int *)(__ptr[3] + 4) != 0) && (__ptr[2] == sVar15)) {
        lVar18 = __ptr[5];
        if (plVar24 != (long *)0x0) {
          plVar17 = plVar24;
          do {
            if ((plVar17[2] == lVar18) &&
               (iVar11 = bcmp(plVar17 + 3,__ptr + 6,lVar18 * 4), iVar11 == 0)) {
              uVar21 = (ulong)*(uint *)(plVar17 + 1);
              goto LAB_00276a70;
            }
            plVar17 = (long *)*plVar17;
          } while (plVar17 != (long *)0x0);
        }
        plVar17 = (long *)malloc(lVar18 * 4 + 0x1c);
        uVar21 = __ptr[1];
        memcpy(plVar17 + 3,__ptr + 6,lVar18 * 4);
        plVar17[2] = lVar18;
        plVar17[1] = uVar21;
        *plVar17 = (long)plVar24;
        plVar24 = plVar17;
LAB_00276a70:
        iVar11 = *(int *)(__ptr + 1);
        if ((iVar11 < (int)uVar21) ||
           ((iVar11 == (int)uVar21 && (*(int *)((long)__ptr + 0xc) < *(int *)((long)plVar17 + 0xc)))
           )) {
          *(int *)(plVar17 + 1) = iVar11;
          *(undefined4 *)((long)plVar17 + 0xc) = *(undefined4 *)((long)__ptr + 0xc);
        }
      }
      iVar11 = *(int *)(__ptr + 1);
      local_a8 = puVar5;
      local_38 = plVar24;
      if (((iVar11 < iVar10) && (uVar21 = __ptr[2], uVar21 < sVar15)) && (*(int *)(__ptr + 4) != 2))
      {
        local_40 = __ptr + 6;
        lVar18 = __ptr[5];
        uVar2 = *(undefined4 *)((long)__ptr + 0xc);
        uVar6 = __ptr[3];
        local_a8 = (undefined8 *)malloc(lVar18 * 4 + 0x38);
        memcpy(local_a8 + 6,local_40,lVar18 * 4);
        local_a8[5] = lVar18;
        *(int *)(local_a8 + 1) = iVar11 + 1;
        *(undefined4 *)((long)local_a8 + 0xc) = uVar2;
        local_a8[2] = uVar21 + 1;
        local_a8[3] = uVar6;
        *(undefined4 *)(local_a8 + 4) = 1;
        *local_a8 = puVar5;
      }
      pwVar23 = *(wchar_t **)(__ptr[3] + 8);
      if (pwVar23 != (wchar_t *)0x0) {
        puVar5 = __ptr + 6;
        do {
          wVar3 = *pwVar23;
          *(wchar_t *)((long)__ptr + __ptr[5] * 4 + 0x30) = wVar3;
          uVar21 = __ptr[2];
          bVar7 = sVar15 <= uVar21;
          if (uVar21 < sVar15) {
            if (local_58 == (long *)0x0) {
              lVar18 = 1;
              if (buf[uVar21] == wVar3) goto LAB_00276bce;
            }
            else {
              lVar18 = (**(code **)(*local_58 + 0x1e8))();
              if (lVar18 != 0) {
                uVar21 = __ptr[2];
LAB_00276bce:
                uVar21 = uVar21 + lVar18;
                uVar19 = __ptr[5];
                goto LAB_00276bd5;
              }
            }
LAB_00276c44:
            bVar7 = true;
          }
          else {
            if (((local_50 == 0) || (uVar21 < local_50)) || (uVar19 = __ptr[5], uVar19 < local_50))
            goto LAB_00276c44;
LAB_00276bd5:
            puVar20 = (undefined8 *)malloc(uVar19 * 4 + 0x3c);
            uVar6 = __ptr[1];
            memcpy(puVar20 + 6,puVar5,uVar19 * 4 + 4);
            puVar20[5] = uVar19 + 1;
            puVar20[1] = uVar6;
            puVar20[2] = uVar21;
            puVar20[3] = pwVar23;
            *(undefined4 *)(puVar20 + 4) = 0;
            *puVar20 = local_a8;
            local_a8 = puVar20;
          }
          iVar11 = *(int *)(__ptr + 1);
          if (iVar11 < iVar10) {
            uVar21 = __ptr[2];
            if (!(bool)(bVar7 ^ 1U | sVar15 <= uVar21)) {
              lVar18 = __ptr[5];
              iVar4 = *(int *)((long)__ptr + 0xc);
              puVar20 = (undefined8 *)malloc(lVar18 * 4 + 0x3c);
              memcpy(puVar20 + 6,puVar5,lVar18 * 4 + 4);
              puVar20[5] = lVar18 + 1;
              *(int *)(puVar20 + 1) = iVar11 + 1;
              *(int *)((long)puVar20 + 0xc) = iVar4 + 1;
              puVar20[2] = uVar21 + 1;
              puVar20[3] = pwVar23;
              *(undefined4 *)(puVar20 + 4) = 3;
              *puVar20 = local_a8;
              local_a8 = puVar20;
            }
            if (*(int *)(__ptr + 4) != 1) {
              lVar18 = __ptr[5];
              iVar11 = *(int *)(__ptr + 1);
              uVar2 = *(undefined4 *)((long)__ptr + 0xc);
              uVar6 = __ptr[2];
              puVar20 = (undefined8 *)malloc(lVar18 * 4 + 0x3c);
              memcpy(puVar20 + 6,puVar5,lVar18 * 4 + 4);
              puVar20[5] = lVar18 + 1;
              *(int *)(puVar20 + 1) = iVar11 + 1;
              *(undefined4 *)((long)puVar20 + 0xc) = uVar2;
              puVar20[2] = uVar6;
              puVar20[3] = pwVar23;
              *(undefined4 *)(puVar20 + 4) = 2;
              *puVar20 = local_a8;
              local_a8 = puVar20;
              goto LAB_00276d65;
            }
          }
          else {
LAB_00276d65:
            if (((*(int *)(__ptr + 4) == 3) && (uVar21 = __ptr[2], uVar21 < sVar15 && uVar21 != 0))
               && ((buf[uVar21 - 1] == *pwVar23 &&
                   (lVar18 = __ptr[5], buf[uVar21] == *(wchar_t *)((long)__ptr + lVar18 * 4 + 0x2c))
                   ))) {
              uVar2 = *(undefined4 *)(__ptr + 1);
              iVar11 = *(int *)((long)__ptr + 0xc);
              puVar20 = (undefined8 *)malloc(lVar18 * 4 + 0x3c);
              memcpy(puVar20 + 6,puVar5,lVar18 * 4 + 4);
              puVar20[5] = lVar18 + 1;
              *(undefined4 *)(puVar20 + 1) = uVar2;
              *(int *)((long)puVar20 + 0xc) = iVar11 + -1;
              puVar20[2] = uVar21 + 1;
              puVar20[3] = pwVar23;
              *(undefined4 *)(puVar20 + 4) = 4;
              *puVar20 = local_a8;
              local_a8 = puVar20;
            }
          }
          pwVar23 = *(wchar_t **)(pwVar23 + 4);
        } while (pwVar23 != (wchar_t *)0x0);
      }
      free(__ptr);
      plVar24 = local_38;
      __ptr = local_a8;
    } while (local_a8 != (undefined8 *)0x0);
    operator_delete__(buf);
    uVar21 = 0;
    plVar17 = plVar24;
    if (plVar24 != (long *)0x0) {
      do {
        uVar22 = ((int)uVar21 + 1) - (uint)((int)plVar17[1] == 0);
        uVar21 = (ulong)uVar22;
        plVar17 = (long *)*plVar17;
      } while (plVar17 != (long *)0x0);
      uVar21 = (ulong)uVar22;
    }
    vVar12 = CVmObjList::create(0,uVar21);
    this_00 = G_obj_table_X.pages_[vVar12 >> 0xc] + (vVar12 & 0xfff);
    uVar21 = (ulong)**(ushort **)((long)&this_00->ptr_ + 8);
    if (uVar21 != 0) {
      CVmObjList::cons_clear((CVmObjList *)this_00,0,uVar21 - 1);
    }
    pvVar9 = sp_;
    pvVar8 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar8 = VM_OBJ;
    (pvVar9->val).obj = vVar12;
    if (plVar24 != (long *)0x0) {
      iVar10 = 0;
      plVar17 = plVar24;
      do {
        if ((int)plVar17[1] != 0) {
          local_70.val.obj = CVmObjList::create(0,3);
          this_01 = (CVmObjList *)
                    ((long)&G_obj_table_X.pages_[local_70.val.obj >> 0xc]->ptr_ +
                    (ulong)((local_70.val.obj & 0xfff) * 0x18));
          local_70.typ = VM_OBJ;
          CVmObjList::cons_set_element((CVmObjList *)this_00,(long)iVar10,&local_70);
          local_60.p_ = (char *)0x0;
          sVar15 = utf8_ptr::setwchars(&local_60,(wchar_t *)(plVar17 + 3),plVar17[2],0);
          vVar13 = CVmObjString::create(0,sVar15);
          local_60.p_ = (char *)(*(long *)((long)&G_obj_table_X.pages_[vVar13 >> 0xc]
                                                  [vVar13 & 0xfff].ptr_ + 8) + 2);
          utf8_ptr::setwchars(&local_60,(wchar_t *)(plVar17 + 3),plVar17[2],sVar15);
          local_70.typ = VM_OBJ;
          local_70.val.obj = vVar13;
          CVmObjList::cons_set_element(this_01,0,&local_70);
          local_70.val.obj = *(undefined4 *)(plVar17 + 1);
          local_70.typ = VM_INT;
          CVmObjList::cons_set_element(this_01,1,&local_70);
          local_70.val.obj = *(vm_obj_id_t *)((long)plVar17 + 0xc);
          local_70.typ = VM_INT;
          CVmObjList::cons_set_element(this_01,2,&local_70);
          iVar10 = iVar10 + 1;
        }
        plVar17 = (long *)*plVar17;
      } while (plVar17 != (long *)0x0);
      do {
        plVar17 = (long *)*plVar24;
        free(plVar24);
        plVar24 = plVar17;
      } while (plVar17 != (long *)0x0);
    }
    local_48->typ = VM_OBJ;
    (local_48->val).obj = vVar12;
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjDict::getp_correct(VMG_ vm_obj_id_t self,
                             vm_val_t *retval, uint *argc)
{
    const char *str;
    size_t strl;
    int max_dist;
    static CVmNativeCodeDesc desc(2);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* pop the word string and maximum edit distance */
    str = CVmBif::pop_str_val(vmg0_);
    max_dist = CVmBif::pop_int_val(vmg0_);

    /* get the string length and character pointer */
    strl = vmb_get_len(str);
    str += VMB_LEN;

    /* for easier processing, convert the string to a wchar_t array */
    size_t wcnt = utf8_ptr::to_wcharz(0, 0, str, strl);
    wchar_t *wstr = new wchar_t[wcnt+1];
    utf8_ptr::to_wcharz(wstr, wcnt+1, str, strl);

    /* if we have a StringComparator, fetch it */
    CVmObjStrComp *cmp = 0;
    size_t trunc_len = 0;
    if (get_ext()->comparator_type_ == VMDICT_COMP_STRCOMP)
    {
        /* get the comparator */
        cmp = (CVmObjStrComp *)get_ext()->comparator_obj_;

        /* note the truncation length */
        trunc_len = cmp->trunc_len();
    }

    /* if we don't have the Trie yet, build it */
    if (get_ext()->trie_ == 0)
        build_trie(vmg0_);

    /* create a stack with the initial empty state */
    corr_stack stk(get_ext()->trie_);

    /* start with an empty result list */
    corr_word *results = 0;

    /* process states until the stack is empty */
    while (!stk.empty())
    {
        /* pop the next state */
        corr_state *s = stk.pop();

        /* 
         *   Check for an 'accept' state.  This is a state where we've
         *   exhausted the input word, and we're at a Trie node that has at
         *   least one word defined.
         */
        if (s->node->word_cnt != 0 && s->ipos == wcnt)
        {
            /*
             *   We've found a matching word (i.e., a candidate dictionary
             *   match for the misspelled input word).  Scan the list of
             *   candidates we've already found to see if we've already
             *   matched this word.
             */
            corr_word *w;
            for (w = results ; w != 0 ; w = w->nxt)
            {
                if (w->strl == s->strl
                    && memcmp(w->str, s->str, s->strl*sizeof(wchar_t)) == 0)
                    break;
            }

            /* if we didn't find an entry, add a new one */
            if (w == 0)
                results = w = new (s->strl) corr_word(
                    s->str, s->strl, s->dist, s->repl, results);

            /* keep the lowest edit distance we've found so far */
            if (s->dist < w->dist
                || (s->dist == w->dist && s->repl < w->repl))
            {
                w->dist = s->dist;
                w->repl = s->repl;
            }
        }

        /*
         *   If we have any edit distance left, try an insertion (i.e., the
         *   input word has an extra letter relative to the dictionary word).
         *   Don't do insertions directly after deletions, though, since
         *   they'd just cancel out.  
         */
        if (s->dist < max_dist && s->ipos < wcnt && s->typ != Deletion)
            stk.push(s->str, s->strl, s->dist + 1, s->repl, s->ipos + 1,
                     s->node, Insertion);

        /* try each possible dictionary transition from here */
        for (vmdict_TrieNode *chi = s->node->chi ; chi != 0 ;
             chi = chi->nxt)
        {
            /* 
             *   Build the next-state string.  Note that we can just add the
             *   character directly to the current state's string buffer,
             *   since we always allocate state structures with one extra
             *   character of padding for just this purpose. 
             */
            s->str[s->strl] = chi->ch;

            /* 
             *   Check for a match to the current character.  If we have a
             *   StringComparator, ask the comparator to check the match.
             *   Otherwise just check for an exact character match. 
             */
            size_t matchlen = 0;
            if (s->ipos < wcnt)
            {
                if (cmp != 0)
                {
                    /* we have a comparator - check it for the match */
                    matchlen = cmp->match_chars(
                        wstr + s->ipos, wcnt - s->ipos, chi->ch);
                }
                else
                {
                    /* no comparator - do a simple character comparison */
                    if (wstr[s->ipos] == chi->ch)
                        matchlen = 1;
                }
                
                /* if we have a match, push a state for it */
                if (matchlen != 0)
                    stk.push(s->str, s->strl + 1, s->dist, s->repl,
                             s->ipos + matchlen, chi, NoChange);
            }
            else
            {
                /* 
                 *   we've reached the end of the input; but if the current
                 *   edit string is at least the truncation length in the
                 *   string comparator, consider this a character match as
                 *   well 
                 */
                if (trunc_len != 0
                    && s->strl >= trunc_len
                    && s->ipos >= trunc_len)
                    stk.push(s->str, s->strl + 1, s->dist, s->repl,
                             s->ipos, chi, NoChange);
            }

            /* if we have any edit distance remaining, try corrections */
            if (s->dist < max_dist)
            {
                /* try a replaced letter */
                if (s->ipos < wcnt && matchlen == 0)
                    stk.push(s->str, s->strl + 1, s->dist + 1, s->repl + 1,
                             s->ipos + 1, chi, Replacement);

                /* try a deletion (i.e., the input is missing a character) */
                if (s->typ != Insertion)
                    stk.push(s->str, s->strl + 1, s->dist + 1, s->repl,
                             s->ipos, chi, Deletion);
            }

            /* 
             *   if we just did a replacement edit, check to see if it's
             *   actually a transposition 
             */
            if (s->typ == Replacement
                && s->ipos > 0 && s->ipos < wcnt
                && wstr[s->ipos - 1] == chi->ch
                && wstr[s->ipos] == s->str[s->strl - 1])
                stk.push(s->str, s->strl + 1, s->dist, s->repl - 1,
                         s->ipos + 1, chi, Transposition);
        }

        /* we've finished processing the current state */
        delete s;
    }

    /* done with the wchar_t version of the word */
    delete [] wstr;

    /* 
     *   Count up the number of result entries.  Only count words with a
     *   non-zero edit distance - words with a zero edit distance are already
     *   matches for the input word, so we can't consider them to be
     *   corrections for it. 
     */
    corr_word *r;
    int i;
    for (r = results, i = 0 ; r != 0 ; r = r->nxt)
    {
        /* if this word has a non-zero edit distance, count it */
        if (r->dist != 0)
            ++i;
    }

    /* allocate a List to hold the results */
    vm_obj_id_t lst_id = CVmObjList::create(vmg_ FALSE, i);
    CVmObjList *lst = (CVmObjList *)vm_objp(vmg_ lst_id);
    lst->cons_clear();

    /* push it for gc protection */
    G_stk->push()->set_obj(lst_id);

    /* create a List [word, distance] for each result */
    for (r = results, i = 0 ; r != 0 ; r = r->nxt)
    {
        vm_val_t val;

        /* 
         *   If this word has a zero edit distance, skip it.  A word with a
         *   zero edit distance is already a match for the original, so it
         *   can't be considered a correction.  
         */
        if (r->dist == 0)
            continue;
        
        /* create the sublist */
        vm_obj_id_t sub_id = CVmObjList::create(vmg_ FALSE, 3);
        CVmObjList *sub = (CVmObjList *)vm_objp(vmg_ sub_id);

        /* add it to the main list */
        val.set_obj(sub_id);
        lst->cons_set_element(i, &val);

        /* measure the utf8 space needed for the string */
        utf8_ptr rp;
        size_t rplen = rp.setwchars(r->str, r->strl, 0);

        /* create the word string */
        vm_obj_id_t lstr_id = CVmObjString::create(vmg_ FALSE, rplen);
        CVmObjString *lstr = (CVmObjString *)vm_objp(vmg_ lstr_id);

        /* encode it */
        rp.set(lstr->cons_get_buf());
        rp.setwchars(r->str, r->strl, rplen);

        /* add it to the sublist */
        val.set_obj(lstr_id);
        sub->cons_set_element(0, &val);

        /* add the edit distance */
        val.set_int(r->dist);
        sub->cons_set_element(1, &val);

        /* add the character replacement count */
        val.set_int(r->repl);
        sub->cons_set_element(2, &val);

        /* count it */
        ++i;
    }

    /* delete the result list */
    while (results != 0)
    {
        /* unlink this element */
        r = results;
        results = results->nxt;

        /* delete it */
        delete r;
    }

    /* return the list value */
    retval->set_obj(lst_id);

    /* done with the gc protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}